

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogExecution.cpp
# Opt level: O0

void __thiscall wasm::LogExecution::visitModule(LogExecution *this,Module *curr)

{
  IString str;
  bool bVar1;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *pvVar2;
  reference this_00;
  pointer pFVar3;
  pointer pFVar4;
  Name name;
  Name local_108;
  reference local_f8;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_1;
  iterator __end4;
  iterator __begin4;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range4;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range3;
  Name local_a8;
  IString local_98 [2];
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_78;
  Type local_60;
  Type local_58;
  Signature local_50;
  HeapType local_40;
  char *local_38;
  HeapType HStack_30;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_20;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> import;
  Module *curr_local;
  LogExecution *this_local;
  
  local_38 = (char *)LOGGER._0_8_;
  HStack_30.id = LOGGER._8_8_;
  import._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)curr;
  wasm::Type::Type(&local_58,i32);
  wasm::Type::Type(&local_60,none);
  Signature::Signature(&local_50,local_58,local_60);
  HeapType::HeapType(&local_40,local_50);
  local_78.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_78);
  name.super_IString.str._M_str = local_38;
  name.super_IString.str._M_len = (size_t)&local_20;
  Builder::makeFunction
            (name,HStack_30,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_40.id,
             (Expression *)&local_78);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_78);
  IString::IString(local_98,"");
  bVar1 = IString::operator!=(&this->loggerModule,local_98);
  if (bVar1) {
    wasm::Name::Name(&local_a8,(IString)(this->loggerModule).str);
    pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_20);
    wasm::Name::operator=(&(pFVar3->super_Importable).module,&local_a8);
  }
  else {
    pvVar2 = (vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              *)((long)import._M_t.
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x18);
    __end3 = std::
             vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ::begin(pvVar2);
    func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
           std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::end(pvVar2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                       *)&func), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                ::operator*(&__end3);
      pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (this_00);
      bVar1 = Importable::imported(&pFVar3->super_Importable);
      if (bVar1) {
        pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                           (this_00);
        bVar1 = IString::operator==(&(pFVar3->super_Importable).module.super_IString,(IString *)ENV)
        ;
        if (bVar1) {
          pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                             (this_00);
          pFVar4 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                             (&local_20);
          wasm::Name::operator=
                    (&(pFVar4->super_Importable).module,&(pFVar3->super_Importable).module);
          break;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
      ::operator++(&__end3);
    }
    pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_20);
    bVar1 = IString::operator_cast_to_bool(&(pFVar3->super_Importable).module.super_IString);
    if (!bVar1) {
      pvVar2 = (vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                *)((long)import._M_t.
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x18);
      __end4 = std::
               vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ::begin(pvVar2);
      func_1 = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
               std::
               vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ::end(pvVar2);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                         *)&func_1), bVar1) {
        local_f8 = __gnu_cxx::
                   __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                   ::operator*(&__end4);
        pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                           (local_f8);
        bVar1 = Importable::imported(&pFVar3->super_Importable);
        if (bVar1) {
          pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                             (local_f8);
          pFVar4 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                             (&local_20);
          wasm::Name::operator=
                    (&(pFVar4->super_Importable).module,&(pFVar3->super_Importable).module);
          break;
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
        ::operator++(&__end4);
      }
    }
    pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_20);
    bVar1 = IString::operator_cast_to_bool(&(pFVar3->super_Importable).module.super_IString);
    if (!bVar1) {
      str.str._M_str = (char *)ENV._8_8_;
      str.str._M_len = ENV._0_8_;
      wasm::Name::Name(&local_108,str);
      pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (&local_20);
      wasm::Name::operator=(&(pFVar3->super_Importable).module,&local_108);
    }
  }
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_20);
  wasm::Name::operator=(&(pFVar3->super_Importable).base,(Name *)LOGGER);
  Module::addFunction((Module *)
                      import._M_t.
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,&local_20);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_20);
  return;
}

Assistant:

void visitModule(Module* curr) {
    // Add the import
    auto import =
      Builder::makeFunction(LOGGER, Signature(Type::i32, Type::none), {});

    if (loggerModule != "") {
      import->module = loggerModule;
    } else {
      // Import the log function from import "env" if the module
      // imports other functions from that name.
      for (auto& func : curr->functions) {
        if (func->imported() && func->module == ENV) {
          import->module = func->module;
          break;
        }
      }

      // If not, then pick the import name of the first function we find.
      if (!import->module) {
        for (auto& func : curr->functions) {
          if (func->imported()) {
            import->module = func->module;
            break;
          }
        }
      }

      // If no function was found, use ENV.
      if (!import->module) {
        import->module = ENV;
      }
    }

    import->base = LOGGER;
    curr->addFunction(std::move(import));
  }